

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

void config_set_value(ALLEGRO_CONFIG *config,ALLEGRO_USTR *section,ALLEGRO_USTR *key,
                     ALLEGRO_USTR *value)

{
  ALLEGRO_CONFIG_ENTRY *pAVar1;
  ALLEGRO_CONFIG_SECTION *section_00;
  ALLEGRO_CONFIG_ENTRY *pAVar2;
  ALLEGRO_USTR *pAVar3;
  Aatree *pAVar4;
  
  section_00 = find_section(config,section);
  if (section_00 != (ALLEGRO_CONFIG_SECTION *)0x0) {
    pAVar2 = find_entry(section_00,key);
    if (pAVar2 != (ALLEGRO_CONFIG_ENTRY *)0x0) {
      al_ustr_assign(pAVar2->value,value);
      al_ustr_trim_ws(pAVar2->value);
      return;
    }
  }
  pAVar2 = (ALLEGRO_CONFIG_ENTRY *)
           al_calloc_with_context
                     (1,0x28,0x89,
                      "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/config.c"
                      ,"config_set_value");
  pAVar2->is_comment = false;
  pAVar3 = al_ustr_dup(key);
  pAVar2->key = pAVar3;
  pAVar3 = al_ustr_dup(value);
  pAVar2->value = pAVar3;
  al_ustr_trim_ws(pAVar3);
  if (section_00 == (ALLEGRO_CONFIG_SECTION *)0x0) {
    section_00 = config_add_section(config,section);
  }
  if (section_00->head == (ALLEGRO_CONFIG_ENTRY *)0x0) {
    section_00->head = pAVar2;
  }
  else {
    pAVar1 = section_00->last;
    pAVar1->next = pAVar2;
    pAVar2->prev = pAVar1;
  }
  section_00->last = pAVar2;
  pAVar4 = _al_aa_insert((Aatree *)section_00->tree,pAVar2->key,pAVar2,cmp_ustr);
  section_00->tree = (_AL_AATREE *)pAVar4;
  return;
}

Assistant:

static void config_set_value(ALLEGRO_CONFIG *config,
   const ALLEGRO_USTR *section, const ALLEGRO_USTR *key,
   const ALLEGRO_USTR *value)
{
   ALLEGRO_CONFIG_SECTION *s;
   ALLEGRO_CONFIG_ENTRY *entry;

   s = find_section(config, section);
   if (s) {
      entry = find_entry(s, key);
      if (entry) {
         al_ustr_assign(entry->value, value);
         al_ustr_trim_ws(entry->value);
         return;
      }
   }

   entry = al_calloc(1, sizeof(ALLEGRO_CONFIG_ENTRY));
   entry->is_comment = false;
   entry->key = al_ustr_dup(key);
   entry->value = al_ustr_dup(value);
   al_ustr_trim_ws(entry->value);

   if (!s) {
      s = config_add_section(config, section);
   }

   if (s->head == NULL) {
      s->head = entry;
      s->last = entry;
   }
   else {
      ASSERT(s->last->next == NULL);
      s->last->next = entry;
      entry->prev = s->last;
      s->last = entry;
   }

   s->tree = _al_aa_insert(s->tree, entry->key, entry, cmp_ustr);
}